

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> * __thiscall
cfd::core::Psbt::GetGlobalRecordKeyList
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,Psbt *this)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  ByteData local_40;
  
  pvVar1 = this->wally_psbt_pointer_;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(long *)((long)pvVar1 + 0x48) != 0) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      ByteData::ByteData(&local_40,*(uint8_t **)(*(long *)((long)pvVar1 + 0x40) + -8 + lVar2),
                         *(uint32_t *)(*(long *)((long)pvVar1 + 0x40) + lVar2));
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(__return_storage_ptr__,&local_40);
      if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 < *(ulong *)((long)pvVar1 + 0x48));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData> Psbt::GetGlobalRecordKeyList() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  std::vector<ByteData> result;
  for (size_t idx = 0; idx < psbt_pointer->unknowns.num_items; ++idx) {
    auto item = &psbt_pointer->unknowns.items[idx];
    result.emplace_back(
        ByteData(item->key, static_cast<uint32_t>(item->key_len)));
  }
  return result;
}